

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::evaluate_solution_fast
          (dxt1_endpoint_optimizer *this,dxt1_solution_coordinates *coords,bool alternate_rounding)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  params *ppVar6;
  unique_color *puVar7;
  bool bVar8;
  uint8 uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  byte bVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  vector<unsigned_char> *pvVar29;
  int iVar30;
  ulong uVar31;
  bool bVar32;
  color_quad_u8 colors [4];
  undefined4 local_a8;
  byte local_a4;
  byte local_a3;
  byte local_a2;
  uint8 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined1 local_9c;
  undefined1 local_9b;
  undefined1 local_9a;
  undefined1 local_99;
  uint local_8c;
  int local_88;
  int local_84;
  vector<unsigned_char> *local_80;
  elemental_vector *local_78;
  ulong local_70;
  ulong local_68;
  undefined1 local_5c [12];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (this->m_trial_solution).m_coords = *coords;
  local_78 = (elemental_vector *)&(this->m_trial_solution).m_selectors;
  uVar10 = (this->m_unique_colors).m_size;
  uVar12 = (this->m_trial_solution).m_selectors.m_size;
  if (uVar12 != uVar10) {
    if (uVar12 <= uVar10) {
      if ((this->m_trial_solution).m_selectors.m_capacity < uVar10) {
        elemental_vector::increase_capacity
                  (local_78,uVar10,uVar12 + 1 == uVar10,1,(object_mover)0x0,false);
      }
      uVar12 = (this->m_trial_solution).m_selectors.m_size;
      memset((this->m_trial_solution).m_selectors.m_p + uVar12,0,(ulong)(uVar10 - uVar12));
    }
    (this->m_trial_solution).m_selectors.m_size = uVar10;
  }
  (this->m_trial_solution).m_error = (this->m_best_solution).m_error;
  (this->m_trial_solution).m_alpha_block = false;
  ppVar6 = this->m_pParams;
  local_8c = 1;
  if (ppVar6->m_pixels_have_alpha == false) {
    uVar31 = 1;
    if (ppVar6->m_force_alpha_blocks == false) {
      local_8c = (uint)ppVar6->m_use_alpha_blocks;
      uVar31 = 0;
    }
  }
  else {
    uVar31 = 1;
  }
  local_80 = &this->m_trial_selectors;
  uVar10 = (this->m_unique_colors).m_size;
  uVar12 = (this->m_trial_selectors).m_size;
  if (uVar12 != uVar10) {
    if (uVar12 <= uVar10) {
      if ((this->m_trial_selectors).m_capacity < uVar10) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_80,uVar10,uVar12 + 1 == uVar10,1,(object_mover)0x0,
                   false);
      }
      uVar12 = (this->m_trial_selectors).m_size;
      memset((this->m_trial_selectors).m_p + uVar12,0,(ulong)(uVar10 - uVar12));
    }
    (this->m_trial_selectors).m_size = uVar10;
  }
  dxt1_block::unpack_color((dxt1_block *)local_5c,coords->m_low_color,true,0xff);
  local_a8 = local_5c._0_4_;
  dxt1_block::unpack_color((dxt1_block *)local_5c,coords->m_high_color,true,0xff);
  local_a4 = local_5c[0];
  local_a3 = local_5c[1];
  local_a2 = local_5c[2];
  local_a1 = local_5c[3];
  uVar18 = (local_5c._0_4_ & 0xff) - (local_a8 & 0xff);
  uVar12 = local_a8 >> 8 & 0xff;
  uVar20 = local_5c[1] - uVar12;
  bVar32 = this->m_perceptual == false;
  uVar10 = uVar20 * 0x18;
  if (bVar32) {
    uVar10 = uVar20;
  }
  local_68 = (ulong)uVar10;
  uVar20 = uVar18 * 8;
  if (bVar32) {
    uVar20 = uVar18;
  }
  local_70 = (ulong)uVar20;
  if ((uint)uVar31 <= local_8c) {
    uVar18 = local_a8 >> 0x10 & 0xff;
    uVar27 = local_5c[2] - uVar18;
    local_5c._4_8_ = ZEXT48(uVar27);
    local_50 = (ulong)(uVar18 * uVar27 + (local_a8 & 0xff) * uVar20 + uVar12 * uVar10);
    local_48 = (ulong)(local_5c[2] * uVar27 + (local_5c._0_4_ & 0xff) * uVar20 +
                      local_5c[1] * uVar10);
    local_84 = uVar20 * 2;
    local_88 = uVar10 * 2;
    local_40 = (ulong)alternate_rounding;
    pvVar29 = local_80;
    do {
      uVar10 = local_a8 & 0xff;
      iVar13 = (int)local_40;
      if ((int)uVar31 == 0) {
        lVar19 = (ulong)((uint)local_a4 + iVar13 + uVar10 * 2) * 0x55555556;
        lVar23 = (ulong)((uint)local_a3 + iVar13 + (uint)local_a8._1_1_ * 2) * 0x55555556;
        lVar14 = (ulong)((uint)local_a2 + iVar13 + (uint)local_a8._2_1_ * 2) * 0x55555556;
        local_a0 = (char)((ulong)lVar19 >> 0x20);
        local_9f = (char)((ulong)lVar23 >> 0x20);
        local_9e = (char)((ulong)lVar14 >> 0x20);
        local_9d = 0xff;
        lVar15 = (ulong)(uVar10 + iVar13 + (uint)local_a4 * 2) * 0x55555556;
        lVar24 = (ulong)((uint)local_a8._1_1_ + iVar13 + (uint)local_a3 * 2) * 0x55555556;
        lVar16 = (ulong)((uint)local_a8._2_1_ + iVar13 + (uint)local_a2 * 2) * 0x55555556;
        local_9c = (char)((ulong)lVar15 >> 0x20);
        local_9b = (char)((ulong)lVar24 >> 0x20);
        local_9a = (char)((ulong)lVar16 >> 0x20);
        local_99 = 0xff;
        lVar17 = (long)(int)(this->m_unique_colors).m_size;
        if (lVar17 < 1) goto LAB_001709a3;
        iVar13 = ((uint)((ulong)lVar14 >> 0x20) & 0xff) * local_5c._4_4_ +
                 ((uint)((ulong)lVar23 >> 0x20) & 0xff) * (int)local_68 +
                 ((uint)((ulong)lVar19 >> 0x20) & 0xff) * (int)local_70;
        iVar21 = ((uint)((ulong)lVar16 >> 0x20) & 0xff) * local_5c._4_4_ +
                 ((uint)((ulong)lVar24 >> 0x20) & 0xff) * (int)local_68 +
                 ((uint)((ulong)lVar15 >> 0x20) & 0xff) * (int)local_70;
        lVar17 = lVar17 + 1;
        uVar11 = 0;
        do {
          puVar7 = (this->m_unique_colors).m_p;
          bVar1 = puVar7[lVar17 + -2].m_color.field_0.field_0.r;
          bVar2 = puVar7[lVar17 + -2].m_color.field_0.field_0.g;
          bVar3 = puVar7[lVar17 + -2].m_color.field_0.field_0.b;
          iVar26 = uVar27 * 2 * (uint)bVar3 + local_88 * (uint)bVar2 + local_84 * (uint)bVar1;
          bVar25 = (iVar26 < iVar21 + (int)local_48) * '\x02' + 1;
          if (iVar26 < iVar21 + iVar13) {
            bVar25 = (iVar13 + (int)local_50 <= iVar26) * '\x02';
          }
          uVar22 = (ulong)bVar25;
          if (this->m_perceptual == true) {
            iVar28 = (uint)bVar1 - (uint)*(byte *)(&local_a8 + uVar22);
            iVar30 = (uint)bVar2 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 1);
            iVar26 = (uint)bVar3 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 2);
            uVar10 = iVar26 * iVar26 + iVar30 * iVar30 * 0x19 + iVar28 * iVar28 * 8;
            pvVar29 = local_80;
          }
          else if (this->m_pParams->m_grayscale_sampling == true) {
            iVar26 = ((uint)bVar3 * 0x1d2f + 0x8000 + (uint)bVar2 * 0x9646 + (uint)bVar1 * 0x4c8b >>
                     0x10) - ((uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 2) * 0x1d2f + 0x8000 +
                              (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 1) * 0x9646 +
                              (uint)*(byte *)(&local_a8 + uVar22) * 0x4c8b >> 0x10);
            uVar10 = iVar26 * iVar26;
          }
          else {
            iVar28 = (uint)bVar1 - (uint)*(byte *)(&local_a8 + uVar22);
            iVar30 = (uint)bVar2 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 1);
            iVar26 = (uint)bVar3 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 2);
            uVar10 = iVar26 * iVar26 + iVar30 * iVar30 + iVar28 * iVar28;
            pvVar29 = local_80;
          }
          uVar11 = uVar11 + (ulong)puVar7[lVar17 + -2].m_weight * (ulong)uVar10;
          if ((this->m_trial_solution).m_error <= uVar11) break;
          pvVar29->m_p[lVar17 + -2] = bVar25;
          lVar17 = lVar17 + -1;
        } while (1 < lVar17);
      }
      else {
        uVar10 = uVar10 + iVar13 + (uint)local_a4 >> 1;
        uVar18 = (uint)local_a8._1_1_ + iVar13 + (uint)local_a3 >> 1;
        uVar12 = (uint)local_a8._2_1_ + iVar13 + (uint)local_a2 >> 1;
        local_a0 = (char)uVar10;
        local_9f = (char)uVar18;
        local_9e = (char)uVar12;
        local_9d = 0xff;
        lVar15 = (long)(int)(this->m_unique_colors).m_size;
        if (lVar15 < 1) {
LAB_001709a3:
          uVar11 = 0;
        }
        else {
          iVar13 = (uVar12 & 0xff) * local_5c._4_4_ +
                   (uVar18 & 0xff) * (int)local_68 + (uVar10 & 0xff) * (int)local_70;
          lVar15 = lVar15 + 1;
          uVar11 = 0;
          do {
            puVar7 = (this->m_unique_colors).m_p;
            bVar1 = puVar7[lVar15 + -2].m_color.field_0.field_0.r;
            bVar2 = puVar7[lVar15 + -2].m_color.field_0.field_0.g;
            bVar3 = puVar7[lVar15 + -2].m_color.field_0.field_0.b;
            iVar21 = uVar27 * 2 * (uint)bVar3 + local_88 * (uint)bVar2 + local_84 * (uint)bVar1;
            uVar22 = (ulong)(byte)((iVar21 < iVar13 + (int)local_48) + 1);
            if (iVar21 < iVar13 + (int)local_50) {
              uVar22 = 0;
            }
            if (this->m_perceptual == true) {
              iVar26 = (uint)bVar1 - (uint)*(byte *)(&local_a8 + uVar22);
              iVar28 = (uint)bVar2 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 1);
              iVar21 = (uint)bVar3 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 2);
              uVar10 = iVar21 * iVar21 + iVar28 * iVar28 * 0x19 + iVar26 * iVar26 * 8;
            }
            else if (this->m_pParams->m_grayscale_sampling == true) {
              iVar21 = ((uint)bVar3 * 0x1d2f + 0x8000 + (uint)bVar2 * 0x9646 + (uint)bVar1 * 0x4c8b
                       >> 0x10) -
                       ((uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 2) * 0x1d2f + 0x8000 +
                        (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 1) * 0x9646 +
                        (uint)*(byte *)(&local_a8 + uVar22) * 0x4c8b >> 0x10);
              uVar10 = iVar21 * iVar21;
            }
            else {
              iVar26 = (uint)bVar1 - (uint)*(byte *)(&local_a8 + uVar22);
              iVar28 = (uint)bVar2 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 1);
              iVar21 = (uint)bVar3 - (uint)*(byte *)((long)&local_a8 + uVar22 * 4 + 2);
              uVar10 = iVar21 * iVar21 + iVar28 * iVar28 + iVar26 * iVar26;
            }
            uVar11 = uVar11 + (ulong)puVar7[lVar15 + -2].m_weight * (ulong)uVar10;
            if ((this->m_trial_solution).m_error <= uVar11) break;
            pvVar29->m_p[lVar15 + -2] = (uchar)uVar22;
            lVar15 = lVar15 + -1;
          } while (1 < lVar15);
        }
      }
      local_9d = 0xff;
      local_38 = uVar31;
      if (uVar11 < (this->m_trial_solution).m_error) {
        (this->m_trial_solution).m_error = uVar11;
        (this->m_trial_solution).m_alpha_block = (int)uVar31 != 0;
        if ((this->m_trial_solution).m_selectors.m_capacity < (this->m_trial_selectors).m_size) {
          if ((uchar *)local_78->m_p != (uchar *)0x0) {
            crnlib_free(local_78->m_p);
            local_78->m_p = (uchar *)0x0;
            *(undefined8 *)&local_78->m_size = 0;
          }
          elemental_vector::increase_capacity
                    (local_78,(this->m_trial_selectors).m_size,false,1,(object_mover)0x0,false);
        }
        else if ((this->m_trial_solution).m_selectors.m_size != 0) {
          (this->m_trial_solution).m_selectors.m_size = 0;
        }
        memcpy((this->m_trial_solution).m_selectors.m_p,(this->m_trial_selectors).m_p,
               (ulong)(this->m_trial_selectors).m_size);
        (this->m_trial_solution).m_selectors.m_size = (this->m_trial_selectors).m_size;
      }
      uVar31 = (ulong)((uint)local_38 + 1);
    } while ((uint)local_38 != local_8c);
  }
  if ((this->m_trial_solution).m_alpha_block == false) {
    uVar4 = (this->m_trial_solution).m_coords.m_low_color;
    uVar5 = (this->m_trial_solution).m_coords.m_high_color;
    if (uVar4 == uVar5) {
      bVar32 = (~uVar4 & 0x1f) != 0;
      if (bVar32) {
        (this->m_trial_solution).m_coords.m_low_color = uVar4 + 1;
      }
      else {
        (this->m_trial_solution).m_coords.m_high_color = uVar5 - 1;
      }
      if ((this->m_unique_colors).m_size != 0) {
        uVar31 = 0;
        do {
          (this->m_trial_solution).m_selectors.m_p[uVar31] = bVar32;
          uVar31 = uVar31 + 1;
        } while (uVar31 < (this->m_unique_colors).m_size);
      }
    }
  }
  uVar31 = (this->m_trial_solution).m_error;
  uVar11 = (this->m_best_solution).m_error;
  if (uVar31 < uVar11) {
    uVar10 = (this->m_best_solution).m_selectors.m_capacity;
    (this->m_best_solution).m_coords = (this->m_trial_solution).m_coords;
    if (uVar10 < (this->m_trial_solution).m_selectors.m_size) {
      pvVar29 = &(this->m_best_solution).m_selectors;
      if (pvVar29->m_p != (uchar *)0x0) {
        crnlib_free(pvVar29->m_p);
        pvVar29->m_p = (uchar *)0x0;
        (this->m_best_solution).m_selectors.m_size = 0;
        (this->m_best_solution).m_selectors.m_capacity = 0;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)pvVar29,(this->m_trial_solution).m_selectors.m_size,false,1,
                 (object_mover)0x0,false);
    }
    else if ((this->m_best_solution).m_selectors.m_size != 0) {
      (this->m_best_solution).m_selectors.m_size = 0;
    }
    memcpy((this->m_best_solution).m_selectors.m_p,(this->m_trial_solution).m_selectors.m_p,
           (ulong)(this->m_trial_solution).m_selectors.m_size);
    (this->m_best_solution).m_selectors.m_size = (this->m_trial_solution).m_selectors.m_size;
    (this->m_best_solution).m_error = (this->m_trial_solution).m_error;
    bVar32 = (this->m_trial_solution).m_alternate_rounding;
    bVar8 = (this->m_trial_solution).m_enforce_selector;
    uVar9 = (this->m_trial_solution).m_enforced_selector;
    (this->m_best_solution).m_alpha_block = (this->m_trial_solution).m_alpha_block;
    (this->m_best_solution).m_alternate_rounding = bVar32;
    (this->m_best_solution).m_enforce_selector = bVar8;
    (this->m_best_solution).m_enforced_selector = uVar9;
  }
  return uVar31 < uVar11;
}

Assistant:

bool dxt1_endpoint_optimizer::evaluate_solution_fast(const dxt1_solution_coordinates& coords, bool alternate_rounding)
    {
        m_trial_solution.m_coords = coords;
        m_trial_solution.m_selectors.resize(m_unique_colors.size());
        m_trial_solution.m_error = m_best_solution.m_error;
        m_trial_solution.m_alpha_block = false;

        uint first_block_type = 0;
        uint last_block_type = 1;

        if ((m_pParams->m_pixels_have_alpha) || (m_pParams->m_force_alpha_blocks))
        {
            first_block_type = 1;
        }
        else if (!m_pParams->m_use_alpha_blocks)
        {
            last_block_type = 0;
        }

        m_trial_selectors.resize(m_unique_colors.size());

        color_quad_u8 colors[cDXT1SelectorValues];
        colors[0] = dxt1_block::unpack_color(coords.m_low_color, true);
        colors[1] = dxt1_block::unpack_color(coords.m_high_color, true);

        int vr = colors[1].r - colors[0].r;
        int vg = colors[1].g - colors[0].g;
        int vb = colors[1].b - colors[0].b;
        if (m_perceptual)
        {
            vr *= 8;
            vg *= 24;
        }

        int stops[4];
        stops[0] = colors[0].r * vr + colors[0].g * vg + colors[0].b * vb;
        stops[1] = colors[1].r * vr + colors[1].g * vg + colors[1].b * vb;

        int dirr = vr * 2;
        int dirg = vg * 2;
        int dirb = vb * 2;

        for (uint block_type = first_block_type; block_type <= last_block_type; block_type++)
        {
            uint64 trial_error = 0;

            if (!block_type)
            {
                colors[2].set_noclamp_rgba((colors[0].r * 2 + colors[1].r + alternate_rounding) / 3, (colors[0].g * 2 + colors[1].g + alternate_rounding) / 3, (colors[0].b * 2 + colors[1].b + alternate_rounding) / 3, 255U);
                colors[3].set_noclamp_rgba((colors[1].r * 2 + colors[0].r + alternate_rounding) / 3, (colors[1].g * 2 + colors[0].g + alternate_rounding) / 3, (colors[1].b * 2 + colors[0].b + alternate_rounding) / 3, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;
                stops[3] = colors[3].r * vr + colors[3].g * vg + colors[3].b * vb;

                // 0 2 3 1
                int c0Point = stops[1] + stops[3];
                int halfPoint = stops[3] + stops[2];
                int c3Point = stops[2] + stops[0];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot >= halfPoint)
                    {
                        best_color_index = (dot < c0Point) ? 3 : 1;
                    }
                    else
                    {
                        best_color_index = (dot < c3Point) ? 0 : 2;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }
            else
            {
                colors[2].set_noclamp_rgba((colors[0].r + colors[1].r + alternate_rounding) >> 1, (colors[0].g + colors[1].g + alternate_rounding) >> 1, (colors[0].b + colors[1].b + alternate_rounding) >> 1, 255U);

                stops[2] = colors[2].r * vr + colors[2].g * vg + colors[2].b * vb;

                // 0 2 1
                int c02Point = stops[0] + stops[2];
                int c21Point = stops[2] + stops[1];

                for (int unique_color_index = (int)m_unique_colors.size() - 1; unique_color_index >= 0; unique_color_index--)
                {
                    const color_quad_u8& c = m_unique_colors[unique_color_index].m_color;

                    int dot = c.r * dirr + c.g * dirg + c.b * dirb;

                    uint8 best_color_index;
                    if (dot < c02Point)
                    {
                        best_color_index = 0;
                    }
                    else if (dot < c21Point)
                    {
                        best_color_index = 2;
                    }
                    else
                    {
                        best_color_index = 1;
                    }

                    uint best_error = color_distance(m_perceptual, c, colors[best_color_index], false);

                    trial_error += best_error * static_cast<uint64>(m_unique_colors[unique_color_index].m_weight);
                    if (trial_error >= m_trial_solution.m_error)
                    {
                        break;
                    }

                    m_trial_selectors[unique_color_index] = static_cast<uint8>(best_color_index);
                }
            }

            if (trial_error < m_trial_solution.m_error)
            {
                m_trial_solution.m_error = trial_error;
                m_trial_solution.m_alpha_block = (block_type != 0);
                m_trial_solution.m_selectors = m_trial_selectors;
            }
        }

        if ((!m_trial_solution.m_alpha_block) && (m_trial_solution.m_coords.m_low_color == m_trial_solution.m_coords.m_high_color))
        {
            uint s;
            if ((m_trial_solution.m_coords.m_low_color & 31) != 31)
            {
                m_trial_solution.m_coords.m_low_color++;
                s = 1;
            }
            else
            {
                m_trial_solution.m_coords.m_high_color--;
                s = 0;
            }

            for (uint i = 0; i < m_unique_colors.size(); i++)
            {
                m_trial_solution.m_selectors[i] = static_cast<uint8>(s);
            }
        }

        if (m_trial_solution.m_error < m_best_solution.m_error)
        {
            m_best_solution = m_trial_solution;
            return true;
        }

        return false;
    }